

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

object * floor_object_for_use(player *p,object *obj,wchar_t num,_Bool message,_Bool *none_left)

{
  object *poVar1;
  wchar_t amt;
  _Bool _Var2;
  wchar_t wVar3;
  object *poVar4;
  loc lVar5;
  char name [80];
  
  wVar3 = (wchar_t)obj->number;
  amt = num;
  if (wVar3 < num) {
    amt = wVar3;
  }
  if (num < wVar3) {
    poVar4 = object_split(obj,amt);
  }
  else {
    square_excise_object((chunk_conflict *)p->cave,obj->grid,obj->known);
    delist_object((chunk_conflict *)p->cave,obj->known);
    square_excise_object(cave,obj->grid,obj);
    delist_object(cave,obj);
    *none_left = true;
    _Var2 = tracked_object_is(p->upkeep,obj);
    if (_Var2) {
      track_object(p->upkeep,(object *)0x0);
    }
    cmd_disable_repeat();
    poVar4 = obj;
  }
  poVar1 = poVar4->known;
  lVar5 = (loc)loc(0,0);
  poVar1->grid = lVar5;
  lVar5 = (loc)loc(0,0);
  poVar4->grid = lVar5;
  if (message) {
    if (poVar4 == obj) {
      obj->number = '\0';
      object_desc(name,0x50,obj,0x43,p);
      obj->number = (uint8_t)amt;
    }
    else {
      object_desc(name,0x50,obj,0x43,p);
    }
    msg("You see %s.",name);
  }
  return poVar4;
}

Assistant:

struct object *floor_object_for_use(struct player *p, struct object *obj,
	int num, bool message, bool *none_left)
{
	struct object *usable;
	char name[80];

	/* Bounds check */
	num = MIN(num, obj->number);

	/* Split off a usable object if necessary */
	if (obj->number > num) {
		usable = object_split(obj, num);
	} else {
		usable = obj;
		square_excise_object(p->cave, usable->grid, usable->known);
		delist_object(p->cave, usable->known);
		square_excise_object(cave, usable->grid, usable);
		delist_object(cave, usable);
		*none_left = true;

		/* Stop tracking item */
		if (tracked_object_is(p->upkeep, obj))
			track_object(p->upkeep, NULL);

		/* The pile is gone, so disable repeat command */
		cmd_disable_repeat();
	}

	/* Object no longer has a location */
	usable->known->grid = loc(0, 0);
	usable->grid = loc(0, 0);

	/* Print a message if requested and there is anything left */
	if (message) {
		if (usable == obj)
			obj->number = 0;

		/* Get a description */
		object_desc(name, sizeof(name), obj,
			ODESC_PREFIX | ODESC_FULL, p);

		if (usable == obj)
			obj->number = num;

		/* Print a message */
		msg("You see %s.", name);
	}

	return usable;
}